

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_circle_gradient(int center_x,int center_y,float radius,rf_color color1,rf_color color2)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  ulong uVar4;
  bool bVar5;
  float x;
  float y;
  float fVar6;
  float fVar7;
  uchar local_58;
  uchar local_44;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 0x6c) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  x = (float)center_x;
  y = (float)center_y;
  local_58 = color2.g;
  local_44 = color2.a;
  uVar4 = 0;
  do {
    rf_gfx_color4ub(color1.r,color1.g,color1.b,color1.a);
    rf_gfx_vertex3f(x,y,((rf__ctx->field_0).current_batch)->current_depth);
    rf_gfx_color4ub(color2.r,local_58,color2.b,local_44);
    fVar6 = sinf((float)(long)uVar4 * 0.017453292);
    fVar7 = cosf((float)(long)uVar4 * 0.017453292);
    rf_gfx_vertex3f(fVar6 * radius + x,fVar7 * radius + y,
                    ((rf__ctx->field_0).current_batch)->current_depth);
    rf_gfx_color4ub(color2.r,local_58,color2.b,local_44);
    fVar6 = (float)(long)(uVar4 + 10) * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius + x,fVar6 * radius + y,
                    ((rf__ctx->field_0).current_batch)->current_depth);
    bVar5 = uVar4 < 0x15e;
    uVar4 = uVar4 + 10;
  } while (bVar5);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_gradient(int center_x, int center_y, float radius, rf_color color1, rf_color color2)
{
    if (rf_gfx_check_buffer_limit(3 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color1.r, color1.g, color1.b, color1.a);
        rf_gfx_vertex2f(center_x, center_y);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}